

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O0

boolean decode_mcu_DC_first(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  jpeg_entropy_decoder *pjVar2;
  JBLOCKROW paJVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint local_50;
  uint local_4c;
  int m;
  int v;
  int sign;
  int tbl;
  int ci;
  int blkn;
  uchar *st;
  JBLOCKROW block;
  arith_entropy_ptr_conflict entropy;
  JBLOCKROW *MCU_data_local;
  j_decompress_ptr cinfo_local;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    if (*(int *)((long)&pjVar2[4].start_pass + 4) == 0) {
      process_restart(cinfo);
    }
    *(int *)((long)&pjVar2[4].start_pass + 4) = *(int *)((long)&pjVar2[4].start_pass + 4) + -1;
  }
  if (*(int *)&pjVar2[2].start_pass != -1) {
    for (tbl = 0; tbl < cinfo->blocks_in_MCU; tbl = tbl + 1) {
      paJVar3 = MCU_data[tbl];
      iVar1 = cinfo->MCU_membership[tbl];
      iVar6 = cinfo->cur_comp_info[iVar1]->dc_tbl_no;
      _ci = (&pjVar2[4].decode_mcu)[iVar6] +
            *(int *)((long)&pjVar2[3].start_pass + (long)iVar1 * 4 + 4);
      iVar4 = arith_decode(cinfo,(uchar *)_ci);
      if (iVar4 == 0) {
        *(undefined4 *)((long)&pjVar2[3].start_pass + (long)iVar1 * 4 + 4) = 0;
      }
      else {
        iVar4 = arith_decode(cinfo,(uchar *)(_ci + 1));
        _ci = _ci + (long)iVar4 + 2;
        local_50 = arith_decode(cinfo,(uchar *)_ci);
        if (local_50 != 0) {
          _ci = (&pjVar2[4].decode_mcu)[iVar6] + 0x14;
          while (iVar5 = arith_decode(cinfo,(uchar *)_ci), iVar5 != 0) {
            local_50 = local_50 << 1;
            if (local_50 == 0x8000) {
              cinfo->err->msg_code = 0x75;
              (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
              *(undefined4 *)&pjVar2[2].start_pass = 0xffffffff;
              return 1;
            }
            _ci = _ci + 1;
          }
        }
        if ((int)local_50 < (int)((1L << (cinfo->arith_dc_L[iVar6] & 0x3f)) >> 1)) {
          *(undefined4 *)((long)&pjVar2[3].start_pass + (long)iVar1 * 4 + 4) = 0;
        }
        else if ((int)((1L << (cinfo->arith_dc_U[iVar6] & 0x3f)) >> 1) < (int)local_50) {
          *(int *)((long)&pjVar2[3].start_pass + (long)iVar1 * 4 + 4) = iVar4 * 4 + 0xc;
        }
        else {
          *(int *)((long)&pjVar2[3].start_pass + (long)iVar1 * 4 + 4) = iVar4 * 4 + 4;
        }
        local_4c = local_50;
        while (local_50 = (int)local_50 >> 1, local_50 != 0) {
          iVar6 = arith_decode(cinfo,(uchar *)(_ci + 0xe));
          if (iVar6 != 0) {
            local_4c = local_50 | local_4c;
          }
        }
        local_4c = local_4c + 1;
        if (iVar4 != 0) {
          local_4c = -local_4c;
        }
        *(uint *)((long)&pjVar2[2].start_pass + (long)iVar1 * 4 + 4) =
             local_4c + *(int *)((long)&pjVar2[2].start_pass + (long)iVar1 * 4 + 4);
      }
      (*paJVar3)[0] =
           (JCOEF)(*(int *)((long)&pjVar2[2].start_pass + (long)iVar1 * 4 + 4) <<
                  ((byte)cinfo->Al & 0x1f));
    }
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_DC_first (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl, sign;
  int v, m;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;	/* if error do nothing */

  /* Outer loop handles each block in the MCU */

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    tbl = cinfo->cur_comp_info[ci]->dc_tbl_no;

    /* Sections F.2.4.1 & F.1.4.4.1: Decoding of DC coefficients */

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.19: Decode_DC_DIFF */
    if (arith_decode(cinfo, st) == 0)
      entropy->dc_context[ci] = 0;
    else {
      /* Figure F.21: Decoding nonzero value v */
      /* Figure F.22: Decoding the sign of v */
      sign = arith_decode(cinfo, st + 1);
      st += 2; st += sign;
      /* Figure F.23: Decoding the magnitude category of v */
      if ((m = arith_decode(cinfo, st)) != 0) {
	st = entropy->dc_stats[tbl] + 20;	/* Table F.4: X1 = 20 */
	while (arith_decode(cinfo, st)) {
	  if ((m <<= 1) == 0x8000) {
	    WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	    entropy->ct = -1;			/* magnitude overflow */
	    return TRUE;
	  }
	  st += 1;
	}
      }
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int) ((1L << cinfo->arith_dc_L[tbl]) >> 1))
	entropy->dc_context[ci] = 0;		   /* zero diff category */
      else if (m > (int) ((1L << cinfo->arith_dc_U[tbl]) >> 1))
	entropy->dc_context[ci] = 12 + (sign * 4); /* large diff category */
      else
	entropy->dc_context[ci] = 4 + (sign * 4);  /* small diff category */
      v = m;
      /* Figure F.24: Decoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
	if (arith_decode(cinfo, st)) v |= m;
      v += 1; if (sign) v = -v;
      entropy->last_dc_val[ci] += v;
    }

    /* Scale and output the DC coefficient (assumes jpeg_natural_order[0]=0) */
    (*block)[0] = (JCOEF) (entropy->last_dc_val[ci] << cinfo->Al);
  }

  return TRUE;
}